

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O0

bool __thiscall
deqp::gls::BuiltinPrecisionTests::
InputLess<deqp::gls::BuiltinPrecisionTests::InTuple<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Matrix<float,_3,_4>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>_>
::operator()(InputLess<deqp::gls::BuiltinPrecisionTests::InTuple<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Matrix<float,_3,_4>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>_>
             *this,InTuple<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Matrix<float,_3,_4>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
                   *in1,
            InTuple<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Matrix<float,_3,_4>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
            *in2)

{
  bool bVar1;
  InTuple<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Matrix<float,_3,_4>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
  *in2_local;
  InTuple<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Matrix<float,_3,_4>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
  *in1_local;
  InputLess<deqp::gls::BuiltinPrecisionTests::InTuple<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Matrix<float,_3,_4>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>_>
  *this_local;
  
  bVar1 = inputLess<tcu::Matrix<float,3,4>>((Matrix<float,_3,_4> *)in1,(Matrix<float,_3,_4> *)in2);
  if (bVar1) {
    this_local._7_1_ = true;
  }
  else {
    bVar1 = inputLess<tcu::Matrix<float,3,4>>((Matrix<float,_3,_4> *)in2,(Matrix<float,_3,_4> *)in1)
    ;
    if (bVar1) {
      this_local._7_1_ = false;
    }
    else {
      bVar1 = inputLess<deqp::gls::BuiltinPrecisionTests::Void>
                        ((Void *)&(in1->
                                  super_Tuple4<tcu::Matrix<float,_3,_4>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>
                                  ).field_0x30,
                         (Void *)&(in2->
                                  super_Tuple4<tcu::Matrix<float,_3,_4>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>
                                  ).field_0x30);
      if (bVar1) {
        this_local._7_1_ = true;
      }
      else {
        bVar1 = inputLess<deqp::gls::BuiltinPrecisionTests::Void>
                          ((Void *)&(in2->
                                    super_Tuple4<tcu::Matrix<float,_3,_4>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>
                                    ).field_0x30,
                           (Void *)&(in1->
                                    super_Tuple4<tcu::Matrix<float,_3,_4>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>
                                    ).field_0x30);
        if (bVar1) {
          this_local._7_1_ = false;
        }
        else {
          bVar1 = inputLess<deqp::gls::BuiltinPrecisionTests::Void>
                            ((Void *)&(in1->
                                      super_Tuple4<tcu::Matrix<float,_3,_4>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>
                                      ).field_0x31,
                             (Void *)&(in2->
                                      super_Tuple4<tcu::Matrix<float,_3,_4>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>
                                      ).field_0x31);
          if (bVar1) {
            this_local._7_1_ = true;
          }
          else {
            bVar1 = inputLess<deqp::gls::BuiltinPrecisionTests::Void>
                              ((Void *)&(in2->
                                        super_Tuple4<tcu::Matrix<float,_3,_4>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>
                                        ).field_0x31,
                               (Void *)&(in1->
                                        super_Tuple4<tcu::Matrix<float,_3,_4>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>
                                        ).field_0x31);
            if (bVar1) {
              this_local._7_1_ = false;
            }
            else {
              bVar1 = inputLess<deqp::gls::BuiltinPrecisionTests::Void>
                                ((Void *)&(in1->
                                          super_Tuple4<tcu::Matrix<float,_3,_4>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>
                                          ).field_0x32,
                                 (Void *)&(in2->
                                          super_Tuple4<tcu::Matrix<float,_3,_4>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>
                                          ).field_0x32);
              if (bVar1) {
                this_local._7_1_ = true;
              }
              else {
                this_local._7_1_ = false;
              }
            }
          }
        }
      }
    }
  }
  return this_local._7_1_;
}

Assistant:

bool operator() (const InTuple<In>& in1, const InTuple<In>& in2) const
	{
		if (inputLess(in1.a, in2.a))
			return true;
		if (inputLess(in2.a, in1.a))
			return false;
		if (inputLess(in1.b, in2.b))
			return true;
		if (inputLess(in2.b, in1.b))
			return false;
		if (inputLess(in1.c, in2.c))
			return true;
		if (inputLess(in2.c, in1.c))
			return false;
		if (inputLess(in1.d, in2.d))
			return true;
		return false;
	}